

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_delete_item_from_array_should_not_broken_list_structure(void)

{
  cJSON *object;
  cJSON *array;
  cJSON *item;
  cJSON *item_00;
  uchar *puVar1;
  cJSON *pcVar2;
  internal_hooks *hooks;
  internal_hooks *hooks_00;
  internal_hooks *hooks_01;
  long in_FS_OFFSET;
  char expected_json3 [21];
  char expected_json2 [33];
  char expected_json1 [21];
  char local_a8 [32];
  char local_88 [48];
  char local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(local_58,"{\"rd\":[{\"a\":\"123\"}]}",0x15);
  builtin_strncpy(local_88 + 0x10,"\"},{\"b\":\"456\"}]}",0x11);
  builtin_strncpy(local_88,"{\"rd\":[{\"a\":\"123",0x10);
  builtin_strncpy(local_a8,"{\"rd\":[{\"b\":\"456\"}]}",0x15);
  pcVar2 = (cJSON *)0x0;
  object = cJSON_ParseWithLengthOpts("{}",3,(char **)0x0,0);
  array = cJSON_AddArrayToObject(object,"rd");
  item = cJSON_ParseWithLengthOpts("{\"a\":\"123\"}",0xc,(char **)0x0,0);
  item_00 = cJSON_ParseWithLengthOpts("{\"b\":\"456\"}",0xc,(char **)0x0,0);
  add_item_to_array(array,item);
  puVar1 = print(object,0,hooks);
  UnityAssertEqualString(local_58,(char *)puVar1,(char *)0x0,0x259);
  free(puVar1);
  add_item_to_array(array,item_00);
  puVar1 = print(object,0,hooks_00);
  UnityAssertEqualString(local_88,(char *)puVar1,(char *)0x0,0x25e);
  free(puVar1);
  if (array != (cJSON *)0x0) {
    pcVar2 = array->child;
  }
  pcVar2 = cJSON_DetachItemViaPointer(array,pcVar2);
  cJSON_Delete(pcVar2);
  puVar1 = print(object,0,hooks_01);
  UnityAssertEqualString(local_a8,(char *)puVar1,(char *)0x0,0x264);
  free(puVar1);
  cJSON_Delete(object);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_delete_item_from_array_should_not_broken_list_structure(void)
{
    const char expected_json1[] = "{\"rd\":[{\"a\":\"123\"}]}";
    const char expected_json2[] = "{\"rd\":[{\"a\":\"123\"},{\"b\":\"456\"}]}";
    const char expected_json3[] = "{\"rd\":[{\"b\":\"456\"}]}";
    char *str1 = NULL;
    char *str2 = NULL;
    char *str3 = NULL;

    cJSON *root = cJSON_Parse("{}");

    cJSON *array = cJSON_AddArrayToObject(root, "rd");
    cJSON *item1 = cJSON_Parse("{\"a\":\"123\"}");
    cJSON *item2 = cJSON_Parse("{\"b\":\"456\"}");

    cJSON_AddItemToArray(array, item1);
    str1 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json1, str1);
    free(str1);

    cJSON_AddItemToArray(array, item2);
    str2 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json2, str2);
    free(str2);

    /* this should not broken list structure */
    cJSON_DeleteItemFromArray(array, 0);
    str3 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json3, str3);
    free(str3);

    cJSON_Delete(root);
}